

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

void __thiscall
glcts::ArraysOfArrays::SizedDeclarationsTypenameStyle4<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (SizedDeclarationsTypenameStyle4<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  TestError *pTVar1;
  undefined1 *local_1b0;
  string *fs;
  string *gs;
  string *tes;
  string *tcs;
  string *vs;
  string *cs;
  string local_178 [39];
  allocator<char> local_151;
  string local_150 [32];
  string local_130 [39];
  allocator<char> local_109;
  string local_108 [39];
  allocator<char> local_e1;
  string local_e0 [32];
  string local_c0 [32];
  undefined1 local_a0 [8];
  string shader_source;
  size_t max_dimension_index;
  string local_70 [8];
  string example_struct_end;
  allocator<char> local_39;
  string local_38 [8];
  string example_struct_begin;
  TestShaderType tested_shader_type_local;
  SizedDeclarationsTypenameStyle4<glcts::ArraysOfArrays::Interface::GL> *this_local;
  
  example_struct_begin.field_2._12_4_ = tested_shader_type;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,"struct light {\n",&local_39);
  std::allocator<char>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,"};\n\n",(allocator<char> *)((long)&max_dimension_index + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&max_dimension_index + 7));
  for (shader_source.field_2._8_8_ = 1; (ulong)shader_source.field_2._8_8_ < 9;
      shader_source.field_2._8_8_ = shader_source.field_2._8_8_ + 1) {
    std::__cxx11::string::string((string *)local_a0,local_38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_e0,"    float",&local_e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_108,"[2]",&local_109);
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode
      ._vptr_TestNode[6])(local_c0,this,local_e0,local_108,shader_source.field_2._8_8_);
    std::__cxx11::string::operator+=((string *)local_a0,local_c0);
    std::__cxx11::string::~string(local_c0);
    std::__cxx11::string::~string(local_108);
    std::allocator<char>::~allocator(&local_109);
    std::__cxx11::string::~string(local_e0);
    std::allocator<char>::~allocator(&local_e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_150," x",&local_151);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_178,"[2]",(allocator<char> *)((long)&cs + 7));
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode
      ._vptr_TestNode[6])(local_130,this,local_150,local_178,8 - shader_source.field_2._8_8_);
    std::__cxx11::string::operator+=((string *)local_a0,local_130);
    std::__cxx11::string::~string(local_130);
    std::__cxx11::string::~string(local_178);
    std::allocator<char>::~allocator((allocator<char> *)((long)&cs + 7));
    std::__cxx11::string::~string(local_150);
    std::allocator<char>::~allocator(&local_151);
    std::__cxx11::string::operator+=((string *)local_a0,";\n");
    std::__cxx11::string::operator+=((string *)local_a0,local_70);
    std::__cxx11::string::operator+=((string *)local_a0,(string *)shader_start_abi_cxx11_);
    switch(example_struct_begin.field_2._12_4_) {
    case 0:
      break;
    case 1:
      std::__cxx11::string::operator+=((string *)local_a0,"\n\tgl_Position = vec4(0.0);\n");
      break;
    case 2:
      break;
    case 3:
      std::__cxx11::string::operator+=((string *)local_a0,(string *)emit_quad_abi_cxx11_);
      break;
    case 4:
      std::__cxx11::string::operator+=((string *)local_a0,(string *)set_tesseation_abi_cxx11_);
      break;
    case 5:
      break;
    default:
      pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar1,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x645);
      __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    std::__cxx11::string::operator+=((string *)local_a0,(string *)shader_end_abi_cxx11_);
    vs = (string *)empty_string_abi_cxx11_;
    tcs = (string *)default_vertex_shader_source_abi_cxx11_;
    tes = (string *)default_tc_shader_source_abi_cxx11_;
    gs = (string *)default_te_shader_source_abi_cxx11_;
    fs = (string *)default_geometry_shader_source_abi_cxx11_;
    local_1b0 = default_fragment_shader_source_abi_cxx11_;
    switch(example_struct_begin.field_2._12_4_) {
    case 0:
      local_1b0 = local_a0;
      break;
    case 1:
      tcs = (string *)local_a0;
      break;
    case 2:
      vs = (string *)local_a0;
      tcs = (string *)empty_string_abi_cxx11_;
      tes = (string *)empty_string_abi_cxx11_;
      gs = (string *)empty_string_abi_cxx11_;
      fs = (string *)empty_string_abi_cxx11_;
      local_1b0 = empty_string_abi_cxx11_;
      break;
    case 3:
      fs = (string *)local_a0;
      break;
    case 4:
      tes = (string *)local_a0;
      break;
    case 5:
      gs = (string *)local_a0;
      break;
    default:
      pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar1,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x648);
      __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode
      ._vptr_TestNode[10])(this,tcs,tes,gs,fs,local_1b0,vs,1,0);
    std::__cxx11::string::~string((string *)local_a0);
  }
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void SizedDeclarationsTypenameStyle4<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string example_struct_begin("struct light {\n");
	std::string example_struct_end("};\n\n");

	for (size_t max_dimension_index = 1; max_dimension_index <= API::MAX_ARRAY_DIMENSIONS; max_dimension_index++)
	{
		std::string shader_source = example_struct_begin;

		shader_source += this->extend_string("    float", "[2]", max_dimension_index);
		shader_source += this->extend_string(" x", "[2]", API::MAX_ARRAY_DIMENSIONS - max_dimension_index);
		shader_source += ";\n";
		shader_source += example_struct_end;
		shader_source += shader_start;

		/* End main */
		DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

		/* Execute test */
		EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
	} /* for (int max_dimension_index = 1; ...) */
}